

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool camp::test::array::get_rvalue_reference(void)

{
  rem<camp::array<int,_2UL>_&> *a_00;
  rem<const_camp::array<int,_2UL>_&> *a_01;
  int *piVar1;
  bool local_29;
  int *b1;
  array<int,_2UL> b;
  int *a0;
  array<int,_2UL> a;
  
  a0 = (int *)0x800000001;
  a_00 = move<camp::array<int,2ul>&>((array<int,_2UL> *)&a0);
  b.elements = (value_type_conflict  [2])get<0ul,int,2ul>(a_00);
  b1 = (int *)0x800000006;
  a_01 = move<camp::array<int,2ul>const&>((array<int,_2UL> *)&b1);
  piVar1 = get<1ul,int,2ul>(a_01);
  local_29 = false;
  if (*(int *)b.elements == 1) {
    local_29 = *piVar1 == 8;
  }
  return local_29;
}

Assistant:

CAMP_TEST_BEGIN(array, get_rvalue_reference)
{
   camp::array<int, 2> a = {1, 8};
   int&& a0 = camp::get<0>(camp::move(a));

   const camp::array<int, 2> b{6, 8};
   const int&& b1 = camp::get<1>(camp::move(b));

   return a0 == 1 &&
          b1 == 8;
}